

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Parser::parse(MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,Parser *this,string *input)

{
  SQLStateMachine *this_00;
  bool bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  runtime_error *prVar4;
  string token_string;
  string key;
  string _token_string;
  Token t;
  
  MultiMap::
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MultiMap(__return_storage_ptr__);
  set_string(this,input);
  this_00 = &this->sql_state;
  SQLStateMachine::reset_state(this_00);
  do {
    if ((this->tokens)._size == 0) {
LAB_00106f97:
      bVar1 = SQLStateMachine::is_invalid(this_00);
      if (!bVar1) {
        bVar1 = SQLStateMachine::is_success(this_00);
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,this->END_OF_INPUT);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Queue<string_tokenizer::Token>::pop(&t,&this->tokens);
    while ((this->tokens)._size != 0) {
      std::__cxx11::string::string((string *)&key,(string *)&t);
      iVar2 = isspace((int)*key._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&key);
      if (iVar2 == 0) break;
      Queue<string_tokenizer::Token>::pop((Token *)&key,&this->tokens);
      string_tokenizer::Token::operator=(&t,(Token *)&key);
      std::__cxx11::string::~string((string *)&key);
    }
    std::__cxx11::string::string((string *)&key,(string *)&t);
    iVar2 = isspace((int)*key._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&key);
    if (iVar2 != 0) {
      std::__cxx11::string::~string((string *)&t);
      goto LAB_00106f97;
    }
    std::__cxx11::string::string((string *)&token_string,(string *)&t);
    iVar2 = SQLStateMachine::update_state(this_00,&token_string);
    bVar1 = SQLStateMachine::is_quote_state(this_00,iVar2);
    if (bVar1) {
      std::__cxx11::string::assign((char *)&token_string);
      while ((this->tokens)._size != 0) {
        bVar1 = SQLStateMachine::is_quote_state(this_00,iVar2);
        if (!bVar1) break;
        Queue<string_tokenizer::Token>::pop((Token *)&key,&this->tokens);
        std::__cxx11::string::string((string *)&_token_string,(string *)&key);
        std::__cxx11::string::~string((string *)&key);
        iVar2 = SQLStateMachine::update_state(this_00,&_token_string);
        bVar1 = std::operator!=(&_token_string,"\"");
        if (bVar1) {
          std::__cxx11::string::append((string *)&token_string);
        }
        std::__cxx11::string::~string((string *)&_token_string);
      }
      bVar1 = SQLStateMachine::is_quote_state(this_00,iVar2);
      if (bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,this->NO_CLOSING_QUOTE);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar1 = SQLStateMachine::is_invalid(this_00);
    if (bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&key,this->UNEXPECTED_TOKEN,&token_string);
      std::runtime_error::runtime_error(prVar4,(string *)&key);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    SQLStateMachine::get_parse_key_abi_cxx11_(&key,this_00,iVar2);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"");
    if (bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key,"command");
      if (bVar1) {
        string_util::uppercase(&_token_string,&token_string);
        pvVar3 = MultiMap::
                 MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::at(__return_storage_ptr__,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar3,&_token_string);
        std::__cxx11::string::~string((string *)&_token_string);
      }
      else {
        pvVar3 = MultiMap::
                 MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::at(__return_storage_ptr__,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar3,&token_string);
      }
    }
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&token_string);
    std::__cxx11::string::~string((string *)&t);
  } while( true );
}

Assistant:

MultiMap::MultiMap<std::string, std::string> Parser::parse(const std::string& input) {
    MultiMap::MultiMap<std::string, std::string> parse_tree;
    set_string(input);
    sql_state.reset_state();
    int last_state = sql_state.get_state();
    while (!tokens.empty()) {
        string_tokenizer::Token t = tokens.pop();

        while (!tokens.empty() && isspace(t.token_str()[0])) {
            t = tokens.pop();
        }
        // we somehow exited the while loop with spaces, it's probably not
        // supposed to be there
        if (isspace(t.token_str()[0]))
            break;

        std::string token_string = t.token_str();
        last_state = sql_state.update_state(token_string);

        if (sql_state.is_quote_state(last_state)) {
            token_string = "";
            while (!tokens.empty() && sql_state.is_quote_state(last_state)) {
                std::string _token_string = tokens.pop().token_str();
                last_state = sql_state.update_state(_token_string);
                if (_token_string != "\"")
                    token_string += _token_string;
            }
            // we exited this loop while never finding a closing quote
            if (sql_state.is_quote_state(last_state))
                throw std::runtime_error(NO_CLOSING_QUOTE);
        }


        if (sql_state.is_invalid())
            throw std::runtime_error(UNEXPECTED_TOKEN + token_string);
        else {
            std::string key = sql_state.get_parse_key(last_state);
            if (key != "") {
                if (key == "command")
                    parse_tree[key] += string_util::uppercase(token_string);
                else
                    parse_tree[key] += token_string;
            }
        }
    }
    if (sql_state.is_invalid() || !sql_state.is_success()) {
        throw std::runtime_error(END_OF_INPUT);
    }
    #ifdef DEBUG
        std::cout << parse_tree << std::endl;
    #endif
    return parse_tree;
}